

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O3

ESlotDef __thiscall FWeaponSlots::AddDefaultWeapon(FWeaponSlots *this,int slot,PClassWeapon *type)

{
  ESlotDef EVar1;
  ulong uVar2;
  ulong uVar3;
  WeaponInfo *pWVar4;
  ulong uVar5;
  bool bVar6;
  
  bVar6 = true;
  uVar2 = 0;
  do {
    uVar3 = (ulong)this->Slots[uVar2].Weapons.Count;
    if (uVar3 != 0) {
      pWVar4 = this->Slots[uVar2].Weapons.Array;
      uVar5 = 0;
      do {
        if (pWVar4->Type == type) {
          if (-1 < (int)uVar5) {
            if (bVar6) {
              return SLOTDEF_Exists;
            }
            goto LAB_00618da1;
          }
          break;
        }
        uVar5 = uVar5 + 1;
        pWVar4 = pWVar4 + 1;
      } while (uVar3 != uVar5);
    }
    bVar6 = uVar2 < 9;
    uVar2 = uVar2 + 1;
    if (uVar2 == 10) {
LAB_00618da1:
      EVar1 = SLOTDEF_Full;
      if ((uint)slot < 10) {
        bVar6 = FWeaponSlot::AddWeapon(this->Slots + (uint)slot,type);
        EVar1 = SLOTDEF_Full - bVar6;
      }
      return EVar1;
    }
  } while( true );
}

Assistant:

ESlotDef FWeaponSlots::AddDefaultWeapon (int slot, PClassWeapon *type)
{
	int currSlot, index;

	if (!LocateWeapon (type, &currSlot, &index))
	{
		if (slot >= 0 && slot < NUM_WEAPON_SLOTS)
		{
			bool added = Slots[slot].AddWeapon (type);
			return added ? SLOTDEF_Added : SLOTDEF_Full;
		}
		return SLOTDEF_Full;
	}
	return SLOTDEF_Exists;
}